

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxLexer.cpp
# Opt level: O0

bool __thiscall Jinx::Impl::Lexer::IsName(Lexer *this,char *ptr)

{
  byte c_00;
  bool bVar1;
  char c;
  char *ptr_local;
  Lexer *this_local;
  
  c_00 = *ptr;
  bVar1 = IsWhitespace(this,c_00);
  if ((bVar1) || (bVar1 = IsNewline(this,c_00), bVar1)) {
    return false;
  }
  if (c_00 < 0x21) {
    return false;
  }
  if ((((((c_00 != 0x2c) && (c_00 != 0x2e)) && (c_00 != 0x5b)) && ((c_00 != 0x5d && (c_00 != 0x28)))
       ) && ((c_00 != 0x29 && ((c_00 != 0x7b && (c_00 != 0x7d)))))) &&
     ((c_00 != 0x2f && (c_00 != 0x27)))) {
    return true;
  }
  return false;
}

Assistant:

inline_t bool Lexer::IsName(const char * ptr) const
	{
		char c = *ptr;
		if (IsWhitespace(c) || IsNewline(c))
			return false;
		if (static_cast<unsigned char>(c) <= 32)
			return false;
		if (c == ',' || c == '.' || c == '[' || c == ']' || c == '(' || c == ')' || c == '{' || c == '}' || c == '/' || c == '\'')
			return false;
		return true;
	}